

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O0

__string_type *
qclab::qasm1<float>(__string_type *__return_storage_ptr__,char *type,int qubit,float angle)

{
  ostream *poVar1;
  char *this;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream stream;
  ostream local_198 [376];
  float local_20;
  int local_1c;
  float angle_local;
  int qubit_local;
  char *type_local;
  
  local_20 = angle;
  local_1c = qubit;
  _angle_local = type;
  type_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,_angle_local);
  this = "(";
  poVar1 = std::operator<<(poVar1,"(");
  qasm_abi_cxx11_(&local_1d8,(qclab *)this,local_20);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  poVar1 = std::operator<<(poVar1,") q[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::operator<<(poVar1,"];\n");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm1( const char type[] , const int qubit , const T angle ) {
    std::stringstream stream ;
    stream << type << "(" << qasm( angle ) << ") q[" << qubit << "];\n" ;
    return stream.str() ;
  }